

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_array_buffer_isView(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValueUnion JVar1;
  JSValue JVar2;
  
  if ((int)argv->tag == -1) {
    JVar1._1_7_ = 0;
    JVar1.int32._0_1_ = (ushort)(*(short *)((long)(argv->u).ptr + 6) - 0x15U) < 10;
  }
  else {
    JVar1.float64 = 0.0;
  }
  JVar2.tag = 1;
  JVar2.u.float64 = JVar1.float64;
  return JVar2;
}

Assistant:

static JSValue js_array_buffer_isView(JSContext *ctx,
                                      JSValueConst this_val,
                                      int argc, JSValueConst *argv)
{
    JSObject *p;
    BOOL res;
    res = FALSE;
    if (JS_VALUE_GET_TAG(argv[0]) == JS_TAG_OBJECT) {
        p = JS_VALUE_GET_OBJ(argv[0]);
        if (p->class_id >= JS_CLASS_UINT8C_ARRAY &&
            p->class_id <= JS_CLASS_DATAVIEW) {
            res = TRUE;
        }
    }
    return JS_NewBool(ctx, res);
}